

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecUtil.c
# Opt level: O2

void Gia_PolynCollectXors_rec(Gia_Man_t *pGia,int iObj,Vec_Int_t *vXors)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pObj;
  ulong uVar5;
  ulong uVar6;
  
  pObj = Gia_ManObj(pGia,iObj);
  iVar2 = Gia_ObjId(pGia,pObj);
  if (pGia->nTravIdsAlloc <= iVar2) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  piVar1 = pGia->pTravIds;
  iVar2 = Gia_ObjId(pGia,pObj);
  if (piVar1[iVar2] != pGia->nTravIds) {
    iVar2 = Gia_ObjId(pGia,pObj);
    if (pGia->nTravIdsAlloc <= iVar2) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar2 = pGia->nTravIds;
    piVar1 = pGia->pTravIds;
    iVar3 = Gia_ObjId(pGia,pObj);
    piVar1[iVar3] = iVar2;
    uVar4 = (uint)*(undefined8 *)pObj;
    if (((~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4) &&
       ((uVar4 & 0x1fffffff) < ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff))) {
      iVar2 = Gia_ObjId(pGia,pObj);
      if (pGia->pRefs[iVar2] < 2) {
        Gia_PolynCollectXors_rec(pGia,iObj - (*(uint *)pObj & 0x1fffffff),vXors);
        Gia_PolynCollectXors_rec(pGia,iObj - (*(uint *)&pObj->field_0x4 & 0x1fffffff),vXors);
        uVar6 = 0;
        uVar5 = (ulong)(uint)vXors->nSize;
        if (vXors->nSize < 1) {
          uVar5 = uVar6;
        }
        do {
          if (uVar5 == uVar6) {
            Vec_IntPush(vXors,iObj);
            return;
          }
          piVar1 = vXors->pArray + uVar6;
          uVar6 = uVar6 + 1;
        } while (*piVar1 != iObj);
      }
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_PolynCollectXors_rec( Gia_Man_t * pGia, int iObj, Vec_Int_t * vXors )
{
    Gia_Obj_t * pObj = Gia_ManObj( pGia, iObj );
    if ( Gia_ObjIsTravIdCurrent(pGia, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(pGia, pObj);
    if ( !Gia_ObjIsAnd(pObj) || !Gia_ObjIsXor(pObj) || Gia_ObjRefNum(pGia, pObj) > 1 )
        return;
    Gia_PolynCollectXors_rec( pGia, Gia_ObjFaninId0(pObj, iObj), vXors );
    Gia_PolynCollectXors_rec( pGia, Gia_ObjFaninId1(pObj, iObj), vXors );
    Vec_IntPushUnique( vXors, iObj );
}